

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch.c
# Opt level: O0

void branch(arm7tdmi_t *state,arminstr_t *arminstr)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint *in_RSI;
  long in_RDI;
  bool bVar4;
  uint32_t newpc;
  uint32_t returnaddress;
  int signed_offset;
  uint32_t offset;
  _Bool negative;
  branch_t *instr;
  ulong in_stack_ffffffffffffffb8;
  uint local_30;
  
  bVar4 = (*in_RSI & 0x800000) != 0;
  local_30 = *in_RSI;
  if (bVar4) {
    local_30 = (*in_RSI & 0xffffff ^ 0xffffffff) + 1;
  }
  local_30 = local_30 & 0xffffff;
  iVar1 = local_30 * 4;
  if (bVar4) {
    iVar1 = local_30 * -4;
  }
  if ((*in_RSI >> 0x18 & 1) != 0) {
    iVar2 = *(int *)(in_RDI + 0xb0) + -4;
    in_stack_ffffffffffffffb8 = (ulong)((*(uint *)(in_RDI + 0xb4) & 0x1f) - 0x11);
    switch(in_stack_ffffffffffffffb8) {
    case 0:
      *(int *)(in_RDI + 0x9c) = iVar2;
      break;
    case 1:
      *(int *)(in_RDI + 0xa8) = iVar2;
      break;
    case 2:
      *(int *)(in_RDI + 0xa0) = iVar2;
      break;
    default:
      *(int *)(in_RDI + 0x98) = iVar2;
      break;
    case 6:
      *(int *)(in_RDI + 0xa4) = iVar2;
      break;
    case 10:
      *(int *)(in_RDI + 0xac) = iVar2;
    }
  }
  uVar3 = *(int *)(in_RDI + 0xb0) + iVar1;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] [B] Hold on to your hats, we\'re jumping to 0x%02X\n",(ulong)uVar3);
  }
  set_pc((arm7tdmi_t *)CONCAT44(uVar3,iVar1),(uint32_t)(in_stack_ffffffffffffffb8 >> 0x20));
  return;
}

Assistant:

void branch(arm7tdmi_t* state, arminstr_t * arminstr) {
    branch_t* instr = &arminstr->parsed.BRANCH;
    bool negative = (instr->offset & 0x800000u) > 0;

    word offset = instr->offset;

    if (negative) {
        // Since this is a 24 bit value stored in a 32 bit int, need to mask away the top 8 bits
        // after doing the two's complement thingy
        offset = (~instr->offset + 1u) & 0xFFFFFFu;
    }
    offset <<= 2u; // This means we can never enter thumb mode through this instruction

    int signed_offset = negative ? -1 * (int)offset : (int)offset;

    if (instr->link) {
        word returnaddress = state->pc - 4;
        set_lr(state, returnaddress);
    }

    word newpc = (state->pc) + signed_offset;
    logdebug("[B] Hold on to your hats, we're jumping to 0x%02X", newpc)
    set_pc(state, newpc & 0xFFFFFFFE);
}